

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Writer.cpp
# Opt level: O2

void __thiscall Writer::unionDefinition(Writer *this,Program *param_1,UnionType *strct)

{
  pointer ppVar1;
  pointer ppVar2;
  string local_70;
  string local_50;
  
  CWriter::startUnion(&this->wr,&(strct->super_AggregateType).name);
  ppVar1 = (strct->super_AggregateType).items.
           super__Vector_base<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar2 = (strct->super_AggregateType).items.
                super__Vector_base<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1) {
    CWriter::indent(&this->wr,1);
    (*ppVar2->first->_vptr_Type[3])(&local_50);
    (*ppVar2->first->_vptr_Type[4])(&local_70,ppVar2->first,&ppVar2->second);
    CWriter::structItem(&this->wr,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  CWriter::endStruct(&this->wr);
  return;
}

Assistant:

void Writer::unionDefinition(const Program& /*program*/, const UnionType* strct) {
    wr.startUnion(strct->name);

    for (const auto& pair : strct->items) {
        const auto& ty = pair.first;
        const auto& name = pair.second;
        wr.indent(1);
        wr.structItem(ty->toString(), ty->surroundName(name));
    }

    wr.endStruct();
}